

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O0

int __thiscall Ym2612_Impl::SLOT_SET(Ym2612_Impl *this,int Adr,int data)

{
  long lVar1;
  slot_t *s;
  uint uVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  slot_t *sl;
  channel_t *ch;
  int nch;
  uint local_4c;
  int local_4;
  
  if ((in_ESI & 3) == 3) {
    local_4 = 1;
  }
  else {
    lVar1 = in_RDI + 0x28 + (long)(int)((in_ESI & 3) + (in_ESI >> 8 & 1) * 3) * 0x2a0;
    s = (slot_t *)(lVar1 + 0x58 + (ulong)((in_ESI >> 2 & 3) * 0x90));
    uVar2 = in_ESI & 0xf0;
    if (uVar2 == 0x30) {
      s->MUL = in_EDX & 0xf;
      if ((in_EDX & 0xf) == 0) {
        s->MUL = 1;
      }
      else {
        s->MUL = s->MUL << 1;
      }
      s->DT = (int *)(in_RDI + 0x3b74 + (long)(int)((int)in_EDX >> 4 & 7) * 0x80);
      *(undefined4 *)(lVar1 + 0xac) = 0xffffffff;
    }
    else if (uVar2 == 0x40) {
      s->TL = in_EDX & 0x7f;
      YM2612_Special_Update();
      s->TLL = s->TL << 5;
    }
    else if (uVar2 == 0x50) {
      s->KSR_S = 3 - ((int)in_EDX >> 6);
      *(undefined4 *)(lVar1 + 0xac) = 0xffffffff;
      if ((in_EDX & 0x1f) == 0) {
        s->AR = (int *)(in_RDI + 0x3fb4);
      }
      else {
        s->AR = (int *)(in_RDI + 0x37f4 + (long)(int)((in_EDX & 0x1f) << 1) * 4);
      }
      s->EincA = s->AR[s->KSR];
      if (s->Ecurp == 0) {
        s->Einc = s->EincA;
      }
    }
    else if (uVar2 == 0x60) {
      s->AMSon = in_EDX & 0x80;
      if ((in_EDX & 0x80) == 0) {
        s->AMS = 0x1f;
      }
      else {
        s->AMS = *(int *)(lVar1 + 0x24);
      }
      if ((in_EDX & 0x1f) == 0) {
        s->DR = (int *)(in_RDI + 0x3fb4);
      }
      else {
        s->DR = (int *)(in_RDI + 0x39f4 + (long)(int)((in_EDX & 0x1f) << 1) * 4);
      }
      s->EincD = s->DR[s->KSR];
      if (s->Ecurp == 1) {
        s->Einc = s->EincD;
      }
    }
    else if (uVar2 == 0x70) {
      if ((in_EDX & 0x1f) == 0) {
        s->SR = (int *)(in_RDI + 0x3fb4);
      }
      else {
        s->SR = (int *)(in_RDI + 0x39f4 + (long)(int)((in_EDX & 0x1f) << 1) * 4);
      }
      s->EincS = s->SR[s->KSR];
      if ((s->Ecurp == 2) && (s->Ecnt < 0x20000000)) {
        s->Einc = s->EincS;
      }
    }
    else if (uVar2 == 0x80) {
      s->SLL = *(int *)(in_RDI + 0x3f74 + (long)((int)in_EDX >> 4) * 4);
      s->RR = (int *)(in_RDI + 0x39f4 + (long)(int)((in_EDX & 0xf) * 4 + 2) * 4);
      s->EincR = s->RR[s->KSR];
      if ((s->Ecurp == 3) && (s->Ecnt < 0x20000000)) {
        s->Einc = s->EincR;
      }
    }
    else if (uVar2 == 0x90) {
      if ((in_EDX & 8) == 0) {
        local_4c = 0;
      }
      else {
        local_4c = in_EDX & 0xf;
      }
      set_seg(s,local_4c);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Ym2612_Impl::SLOT_SET( int Adr, int data )
{
	int nch = Adr & 3;
	if ( nch == 3 )
		return 1;
	
	channel_t& ch = YM2612.CHANNEL [nch + (Adr & 0x100 ? 3 : 0)];
	slot_t& sl = ch.SLOT [(Adr >> 2) & 3];

	switch ( Adr & 0xF0 )
	{
		case 0x30:
			if ( (sl.MUL = (data & 0x0F)) != 0 ) sl.MUL <<= 1;
			else sl.MUL = 1;

			sl.DT = (int*) g.DT_TAB [(data >> 4) & 7];

			ch.SLOT [0].Finc = -1;

			break;

		case 0x40:
			sl.TL = data & 0x7F;

			// SOR2 do a lot of TL adjustement and this fix R.Shinobi jump sound...
			YM2612_Special_Update();

#if ((ENV_HBITS - 7) < 0)
			sl.TLL = sl.TL >> (7 - ENV_HBITS);
#else
			sl.TLL = sl.TL << (ENV_HBITS - 7);
#endif

			break;

		case 0x50:
			sl.KSR_S = 3 - (data >> 6);

			ch.SLOT [0].Finc = -1;

			if (data &= 0x1F) sl.AR = (int*) &g.AR_TAB [data << 1];
			else sl.AR = (int*) &g.NULL_RATE [0];

			sl.EincA = sl.AR [sl.KSR];
			if (sl.Ecurp == ATTACK) sl.Einc = sl.EincA;
			break;

		case 0x60:
			if ( (sl.AMSon = (data & 0x80)) != 0 ) sl.AMS = ch.AMS;
			else sl.AMS = 31;

			if (data &= 0x1F) sl.DR = (int*) &g.DR_TAB [data << 1];
			else sl.DR = (int*) &g.NULL_RATE [0];

			sl.EincD = sl.DR [sl.KSR];
			if (sl.Ecurp == DECAY) sl.Einc = sl.EincD;
			break;

		case 0x70:
			if (data &= 0x1F) sl.SR = (int*) &g.DR_TAB [data << 1];
			else sl.SR = (int*) &g.NULL_RATE [0];

			sl.EincS = sl.SR [sl.KSR];
			if ((sl.Ecurp == SUBSTAIN) && (sl.Ecnt < ENV_END)) sl.Einc = sl.EincS;
			break;

		case 0x80:
			sl.SLL = g.SL_TAB [data >> 4];

			sl.RR = (int*) &g.DR_TAB [((data & 0xF) << 2) + 2];

			sl.EincR = sl.RR [sl.KSR];
			if ((sl.Ecurp == RELEASE) && (sl.Ecnt < ENV_END)) sl.Einc = sl.EincR;
			break;

		case 0x90:
			// SSG-EG envelope shapes :
			/*
			   E  At Al H
			  
			   1  0  0  0  \\\\
			   1  0  0  1  \___
			   1  0  1  0  \/\/
			   1  0  1  1  \
			   1  1  0  0  ////
			   1  1  0  1  /
			   1  1  1  0  /\/\
			   1  1  1  1  /___
			  
			   E  = SSG-EG enable
			   At = Start negate
			   Al = Altern
			   H  = Hold */

			set_seg( sl, (data & 8) ? (data & 0x0F) : 0 );
			break;
	}

	return 0;
}